

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<double>::growTo(vec<double> *this,uint size,double *pad)

{
  double *pdVar1;
  ulong uVar2;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar2 = (ulong)this->sz;
    if (this->sz < size) {
      pdVar1 = this->data;
      do {
        pdVar1[uVar2] = *pad;
        uVar2 = uVar2 + 1;
      } while (size != uVar2);
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size, const T& pad) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T(pad);
		}
		sz = size;
	}